

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall
MutableS2ShapeIndex::UpdateFaceEdges
          (MutableS2ShapeIndex *this,int face,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *face_edges,InteriorTracker *tracker)

{
  int iVar1;
  pointer pFVar2;
  MutableS2ShapeIndex *this_00;
  InteriorTracker *tracker_00;
  CellRelation CVar3;
  long lVar4;
  S2CellId target;
  ulong uVar5;
  undefined4 in_register_00000034;
  S2PaddedCell *pSVar6;
  S2PaddedCell *pSVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  const_iterator cVar12;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  clipped_edges;
  vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  clipped_edge_storage;
  R2Rect bound;
  EdgeAllocator alloc;
  S2PaddedCell pcell;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  local_198;
  long local_180;
  vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  local_178;
  MutableS2ShapeIndex *local_160;
  InteriorTracker *local_158;
  long local_150;
  R2Rect local_148;
  S2PaddedCell local_128;
  EdgeAllocator local_c8;
  undefined1 local_90 [16];
  ostream *poStack_80;
  double dStack_78;
  MutableS2ShapeIndex *pMStack_70;
  
  local_150 = CONCAT44(in_register_00000034,face);
  bVar11 = 0;
  lVar9 = ((long)(face_edges->
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(face_edges->
                 super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  uVar8 = (uint)lVar9;
  if ((uVar8 == 0) &&
     ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    return;
  }
  local_178.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge *)0x0;
  local_178.
  super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (ClippedEdge *)0x0;
  local_198.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (ClippedEdge **)0x0;
  local_198.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge **)0x0;
  std::vector<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>::
  reserve(&local_178,(long)(int)uVar8);
  std::
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ::reserve(&local_198,(long)(int)uVar8);
  lVar4 = 8;
  do {
    *(undefined8 *)((long)&local_150 + lVar4) = 0x3ff0000000000000;
    *(undefined8 *)((long)local_148.bounds_[0].bounds_.c_ + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x28);
  local_148.bounds_[0].bounds_.c_[0] = 1.0;
  local_148.bounds_[0].bounds_.c_[1] = 0.0;
  local_148.bounds_[1].bounds_.c_[0] = 1.0;
  local_148.bounds_[1].bounds_.c_[1] = 0.0;
  local_180 = lVar9;
  local_160 = this;
  local_158 = tracker;
  if (0 < (int)uVar8) {
    uVar5 = 0;
    do {
      lVar9 = 0x10;
      do {
        *(undefined8 *)(local_90 + lVar9 + -8) = 0x3ff0000000000000;
        *(undefined8 *)(local_90 + lVar9) = 0;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x30);
      if (dStack_78 <= (double)pMStack_70 == (double)poStack_80 < (double)local_90._8_8_) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
                   ,0xb1,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_128.padding_,"Check failed: is_valid() ",0x19);
        abort();
      }
      pFVar2 = (face_edges->
               super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_90._0_8_ = pFVar2 + uVar5;
      R2Rect::FromPointPair((R2Rect *)&local_128,&pFVar2[uVar5].a,&pFVar2[uVar5].b);
      dStack_78 = local_128.bound_.bounds_[0].bounds_.c_[0];
      pMStack_70 = (MutableS2ShapeIndex *)local_128.bound_.bounds_[0].bounds_.c_[1];
      local_90._8_8_ = local_128.id_.id_;
      poStack_80 = (ostream *)local_128.padding_;
      if (local_178.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_178.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<MutableS2ShapeIndex::ClippedEdge,std::allocator<MutableS2ShapeIndex::ClippedEdge>>::
        _M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const&>
                  ((vector<MutableS2ShapeIndex::ClippedEdge,std::allocator<MutableS2ShapeIndex::ClippedEdge>>
                    *)&local_178,
                   (iterator)
                   local_178.
                   super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ClippedEdge *)local_90);
      }
      else {
        ((local_178.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[1].bounds_.c_[1] =
             local_128.bound_.bounds_[0].bounds_.c_[1];
        ((local_178.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[0].bounds_.c_[1] =
             local_128.padding_;
        ((local_178.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[1].bounds_.c_[0] =
             local_128.bound_.bounds_[0].bounds_.c_[0];
        (local_178.
         super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
         ._M_impl.super__Vector_impl_data._M_finish)->face_edge = (FaceEdge *)local_90._0_8_;
        ((local_178.
          super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish)->bound).bounds_[0].bounds_.c_[0] =
             (VType)local_128.id_.id_;
        local_178.
        super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_178.
             super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_128.id_.id_ =
           (uint64)(local_178.
                    super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      if (local_198.
          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_198.
          super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
        ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                  ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                    *)&local_198,
                   (iterator)
                   local_198.
                   super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ClippedEdge **)&local_128);
      }
      else {
        *local_198.
         super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge *)local_128.id_.id_;
        local_198.
        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_198.
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      R2Rect::AddRect(&local_148,(R2Rect *)(local_90 + 8));
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar8 & 0x7fffffff));
  }
  local_c8.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.size_ = 0;
  local_c8.clipped_edges_.
  super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.face_edges_.
  super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = local_150 << 0x3d;
  S2PaddedCell::S2PaddedCell
            ((S2PaddedCell *)local_90,(S2CellId)(uVar5 | 0x1000000000000000),kCellPadding);
  tracker_00 = local_158;
  this_00 = local_160;
  iVar1 = local_160->pending_additions_begin_;
  if (0 < (int)local_180) {
    target = S2PaddedCell::ShrinkToFit((S2PaddedCell *)local_90,&local_148);
    if ((this_00->pending_additions_begin_ != 0) && (target.id_ != local_90._0_8_)) {
      local_128.padding_ = -NAN;
      local_128.bound_.bounds_[0].bounds_.c_[0] = 0.0;
      local_128.id_.id_ = (uint64)&PTR__IteratorBase_002c10d0;
      local_128.bound_.bounds_[1].bounds_.c_[0] = 0.0;
      local_128.bound_.bounds_[1].bounds_.c_[1]._0_4_ = 0xffffffff;
      local_128.middle_.bounds_[0].bounds_.c_[0] = 0.0;
      local_128.middle_.bounds_[0].bounds_.c_[1]._0_4_ = 0xffffffff;
      local_128.bound_.bounds_[0].bounds_.c_[1] = (VType)this_00;
      cVar12 = gtl::internal_btree::
               btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
               ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                      *)&this_00->cell_map_);
      local_128.bound_.bounds_[1].bounds_.c_[0] = (VType)cVar12.node;
      local_128.bound_.bounds_[1].bounds_.c_[1]._0_4_ = cVar12.position;
      local_128.padding_ = -NAN;
      local_128.bound_.bounds_[0].bounds_.c_[0] = 0.0;
      local_128.middle_.bounds_[0].bounds_.c_[0] = local_128.bound_.bounds_[1].bounds_.c_[0];
      local_128.middle_.bounds_[0].bounds_.c_[1]._0_4_ =
           local_128.bound_.bounds_[1].bounds_.c_[1]._0_4_;
      CVar3 = S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
                        (target,(Iterator *)&local_128);
      if (CVar3 == INDEXED) {
        target.id_ = (uint64)local_128.padding_;
      }
    }
    if (target.id_ != local_90._0_8_) {
      uVar10 = ~target.id_ & target.id_ - 1;
      SkipCellRange(this_00,(S2CellId)(uVar5 | 1),(S2CellId)(target.id_ - uVar10),tracker_00,
                    &local_c8,iVar1 == 0);
      S2PaddedCell::S2PaddedCell(&local_128,target,kCellPadding);
      pSVar6 = &local_128;
      pSVar7 = (S2PaddedCell *)local_90;
      for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pSVar7->id_).id_ = (pSVar6->id_).id_;
        pSVar6 = (S2PaddedCell *)((long)pSVar6 + ((ulong)bVar11 * -2 + 1) * 8);
        pSVar7 = (S2PaddedCell *)((long)pSVar7 + (ulong)bVar11 * -0x10 + 8);
      }
      UpdateEdges(this_00,(S2PaddedCell *)local_90,&local_198,tracker_00,&local_c8,iVar1 == 0);
      uVar10 = uVar10 + target.id_;
      SkipCellRange(this_00,(S2CellId)(uVar10 + (-uVar10 & uVar10) * 2),
                    (S2CellId)(uVar5 + 0x2000000000000001),tracker_00,&local_c8,iVar1 == 0);
      goto LAB_00194470;
    }
  }
  UpdateEdges(this_00,(S2PaddedCell *)local_90,&local_198,tracker_00,&local_c8,iVar1 == 0);
LAB_00194470:
  if (local_c8.face_edges_.
      super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.face_edges_.
                    super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
  ::~vector(&local_c8.clipped_edges_);
  if (local_198.
      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.
      super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<MutableS2ShapeIndex::ClippedEdge,_std::allocator<MutableS2ShapeIndex::ClippedEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateFaceEdges(int face,
                                          const vector<FaceEdge>& face_edges,
                                          InteriorTracker* tracker) {
  int num_edges = face_edges.size();
  if (num_edges == 0 && tracker->shape_ids().empty()) return;

  // Create the initial ClippedEdge for each FaceEdge.  Additional clipped
  // edges are created when edges are split between child cells.  We create
  // two arrays, one containing the edge data and another containing pointers
  // to those edges, so that during the recursion we only need to copy
  // pointers in order to propagate an edge to the correct child.
  vector<ClippedEdge> clipped_edge_storage;
  vector<const ClippedEdge*> clipped_edges;
  clipped_edge_storage.reserve(num_edges);
  clipped_edges.reserve(num_edges);
  R2Rect bound = R2Rect::Empty();
  for (int e = 0; e < num_edges; ++e) {
    ClippedEdge clipped;
    clipped.face_edge = &face_edges[e];
    clipped.bound = R2Rect::FromPointPair(face_edges[e].a, face_edges[e].b);
    clipped_edge_storage.push_back(clipped);
    clipped_edges.push_back(&clipped_edge_storage.back());
    bound.AddRect(clipped.bound);
  }
  // Construct the initial face cell containing all the edges, and then update
  // all the edges in the index recursively.
  EdgeAllocator alloc;
  S2CellId face_id = S2CellId::FromFace(face);
  S2PaddedCell pcell(face_id, kCellPadding);

  // "disjoint_from_index" means that the current cell being processed (and
  // all its descendants) are not already present in the index.
  bool disjoint_from_index = is_first_update();
  if (num_edges > 0) {
    S2CellId shrunk_id = ShrinkToFit(pcell, bound);
    if (shrunk_id != pcell.id()) {
      // All the edges are contained by some descendant of the face cell.  We
      // can save a lot of work by starting directly with that cell, but if we
      // are in the interior of at least one shape then we need to create
      // index entries for the cells we are skipping over.
      SkipCellRange(face_id.range_min(), shrunk_id.range_min(),
                    tracker, &alloc, disjoint_from_index);
      pcell = S2PaddedCell(shrunk_id, kCellPadding);
      UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
      SkipCellRange(shrunk_id.range_max().next(), face_id.range_max().next(),
                    tracker, &alloc, disjoint_from_index);
      return;
    }
  }
  // Otherwise (no edges, or no shrinking is possible), subdivide normally.
  UpdateEdges(pcell, &clipped_edges, tracker, &alloc, disjoint_from_index);
}